

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  u32 uVar8;
  u32 uVar9;
  u8 uVar10;
  int iVar11;
  long lVar12;
  sqlite3_io_methods *psVar13;
  u8 *aFrame;
  u64 n;
  int iVar14;
  sqlite3_file *psVar15;
  ulong uVar16;
  int iVar17;
  u32 *puVar18;
  uint uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  i64 szWal;
  u32 pgno;
  void *pDummy;
  u8 aBuf [32];
  long local_88;
  u32 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  u32 local_64;
  void *local_60;
  undefined1 local_58 [16];
  long local_48;
  
  if (5 < cnt) {
    if (100 < (uint)cnt) {
      return 0xf;
    }
    iVar14 = 1;
    if (9 < (uint)cnt) {
      iVar14 = (cnt + -9) * (cnt + -9) * 0x27;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar14);
  }
  if (useWal == 0) {
    if (pWal->bShmUnreliable == '\0') {
      iVar14 = walIndexReadHdr(pWal,pChanged);
      if (iVar14 != 0) {
        if (iVar14 != 5) {
          return iVar14;
        }
        if (*pWal->apWiData == (u32 *)0x0) {
          return -1;
        }
        if (pWal->exclusiveMode != '\0') {
          return -1;
        }
        iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,2,1,6);
        if (iVar14 != 0) {
          iVar11 = 0x105;
          goto LAB_0014ab73;
        }
        if (pWal->exclusiveMode != '\0') {
          return -1;
        }
        psVar15 = pWal->pDbFd;
        psVar13 = psVar15->pMethods;
        iVar11 = 2;
        goto LAB_0014ab39;
      }
      if (pWal->bShmUnreliable == '\0') {
        puVar18 = *pWal->apWiData + 0x18;
        iVar14 = 0;
        if ((*pWal->apWiData)[0x18] == (pWal->hdr).mxFrame) {
          uVar10 = pWal->exclusiveMode;
          iVar14 = 0;
          if (uVar10 == '\0') {
            iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6);
            uVar10 = pWal->exclusiveMode;
          }
          if (uVar10 != '\x02') {
            (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
          }
          if (iVar14 != 5) {
            if (iVar14 != 0) {
              return iVar14;
            }
            iVar14 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
            if (iVar14 == 0) {
              pWal->readLock = 0;
              return 0;
            }
            if (pWal->exclusiveMode != '\0') {
              return -1;
            }
            psVar15 = pWal->pDbFd;
            psVar13 = psVar15->pMethods;
            iVar11 = 3;
            goto LAB_0014ab39;
          }
        }
        goto LAB_0014a8a7;
      }
    }
    if ((pWal->exclusiveMode == '\0') &&
       (iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6), iVar14 != 0)) {
      iVar11 = -1;
      if (iVar14 != 5) {
        iVar11 = iVar14;
      }
    }
    else {
      pWal->readLock = 0;
      aFrame = (u8 *)0x0;
      iVar14 = (*pWal->pDbFd->pMethods->xShmMap)(pWal->pDbFd,0,0x8000,0,&local_60);
      iVar11 = -1;
      if (iVar14 != 8) {
        if (iVar14 == 0x508) {
          psVar15 = pWal->pWalFd;
          puVar18 = *pWal->apWiData;
          uVar3 = puVar18[1];
          uVar4 = *(undefined8 *)(puVar18 + 2);
          uVar8 = puVar18[4];
          uVar9 = puVar18[5];
          uVar5 = *(undefined8 *)(puVar18 + 6);
          uVar6 = *(undefined8 *)(puVar18 + 8);
          uVar7 = *(undefined8 *)(puVar18 + 10);
          (pWal->hdr).iVersion = puVar18[0];
          (pWal->hdr).unused = uVar3;
          (pWal->hdr).iChange = (int)uVar4;
          (pWal->hdr).isInit = (char)((ulong)uVar4 >> 0x20);
          (pWal->hdr).bigEndCksum = (char)((ulong)uVar4 >> 0x28);
          (pWal->hdr).szPage = (short)((ulong)uVar4 >> 0x30);
          (pWal->hdr).mxFrame = uVar8;
          (pWal->hdr).nPage = uVar9;
          *(undefined8 *)(pWal->hdr).aFrameCksum = uVar5;
          *(undefined8 *)(pWal->hdr).aSalt = uVar6;
          *(undefined8 *)(pWal->hdr).aCksum = uVar7;
          iVar11 = (*psVar15->pMethods->xFileSize)(psVar15,&local_88);
          if (iVar11 != 0) goto LAB_0014adba;
          if (local_88 < 0x20) {
            *pChanged = 1;
            aFrame = (u8 *)0x0;
            iVar14 = -(uint)((pWal->hdr).mxFrame != 0);
          }
          else {
            iVar11 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,local_58,0x20,0);
            if ((iVar11 != 0) || (iVar11 = -1, *(long *)(pWal->hdr).aSalt != local_48))
            goto LAB_0014adba;
            uVar3 = pWal->szPage;
            iVar14 = sqlite3_initialize();
            iVar11 = 7;
            if (iVar14 != 0) goto LAB_0014adba;
            iVar17 = uVar3 + 0x18;
            n = (u64)iVar17;
            aFrame = (u8 *)sqlite3Malloc(n);
            iVar11 = 7;
            if (aFrame == (u8 *)0x0) goto LAB_0014adba;
            uVar16 = *(ulong *)(pWal->hdr).aFrameCksum;
            lVar12 = (ulong)(pWal->szPage + 0x18) * (ulong)(pWal->hdr).mxFrame;
            if (local_88 < (long)(n + lVar12 + 0x20)) {
              iVar14 = 0;
              uVar20 = (int)uVar16;
              uVar21 = (int)(uVar16 >> 0x20);
            }
            else {
              uStack_70 = 0;
              lVar12 = lVar12 + 0x20;
              local_78 = uVar16;
              do {
                iVar14 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,iVar17,lVar12);
                if (iVar14 != 0) goto LAB_0014ad9d;
                iVar14 = walDecodeFrame(pWal,&local_64,&local_7c,aFrame + 0x18,aFrame);
                if (iVar14 == 0) break;
                if (local_7c != 0) {
                  iVar14 = -1;
                  goto LAB_0014ad9d;
                }
                lVar12 = lVar12 + n;
              } while ((long)(n + lVar12) <= local_88);
              iVar14 = 0;
LAB_0014ad9d:
              uVar20 = (undefined4)local_78;
              uVar21 = local_78._4_4_;
            }
            *(ulong *)(pWal->hdr).aFrameCksum = CONCAT44(uVar21,uVar20);
          }
        }
        sqlite3_free(aFrame);
        iVar11 = iVar14;
        if (iVar14 == 0) {
          return 0;
        }
      }
    }
LAB_0014adba:
    if (0 < pWal->nWiData) {
      lVar12 = 0;
      do {
        sqlite3_free(pWal->apWiData[lVar12]);
        pWal->apWiData[lVar12] = (u32 *)0x0;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pWal->nWiData);
    }
    pWal->bShmUnreliable = '\0';
    sqlite3WalEndReadTransaction(pWal);
    *pChanged = 1;
    return iVar11;
  }
  puVar18 = *pWal->apWiData + 0x18;
  iVar14 = 0;
LAB_0014a8a7:
  uVar1 = (pWal->hdr).mxFrame;
  uVar19 = 0;
  lVar12 = 2;
  uVar16 = 0;
  do {
    uVar2 = puVar18[lVar12];
    if (uVar2 <= uVar1 && uVar19 <= uVar2) {
      uVar16 = (ulong)((int)lVar12 - 1);
      uVar19 = uVar2;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  if ((pWal->readOnly & 2) == 0) {
    if ((uVar19 < uVar1) || ((int)uVar16 == 0)) {
      lVar12 = 0;
      local_78 = uVar16;
      do {
        iVar14 = (int)lVar12 + 4;
        if (pWal->exclusiveMode != '\0') {
LAB_0014aaa3:
          puVar18[lVar12 + 2] = uVar1;
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar14,1,9);
          }
          uVar16 = (ulong)((int)lVar12 + 1);
          uVar19 = uVar1;
          goto LAB_0014aad3;
        }
        iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar14,1,10);
        if (iVar11 != 5) {
          if (iVar11 != 0) {
            return iVar11;
          }
          goto LAB_0014aaa3;
        }
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 4);
      iVar14 = 5;
      uVar16 = local_78;
      goto LAB_0014a94a;
    }
  }
  else {
LAB_0014a94a:
    if ((int)uVar16 == 0) {
      return -(uint)(iVar14 == 5) | 0x508;
    }
  }
LAB_0014aad3:
  iVar11 = (int)uVar16 + 3;
  uVar10 = pWal->exclusiveMode;
  if (uVar10 == '\0') {
    iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar11,1,6);
    if (iVar14 != 0) {
      iVar11 = -1;
LAB_0014ab73:
      if (iVar14 != 5) {
        return iVar14;
      }
      return iVar11;
    }
    uVar10 = pWal->exclusiveMode;
  }
  pWal->minFrame = *puVar18 + 1;
  if (uVar10 != '\x02') {
    (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
  }
  if ((puVar18[(long)(int)uVar16 + 1] == uVar19) &&
     (iVar14 = bcmp(*pWal->apWiData,&pWal->hdr,0x30), iVar14 == 0)) {
    pWal->readLock = (i16)uVar16;
    return 0;
  }
  if (pWal->exclusiveMode != '\0') {
    return -1;
  }
  psVar15 = pWal->pDbFd;
  psVar13 = psVar15->pMethods;
LAB_0014ab39:
  (*psVar13->xShmLock)(psVar15,iVar11,1,5);
  return -1;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */
  u32 mxFrame;                    /* Wal frame to lock to */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* useWal may only be set for read/write connections */
  assert( (pWal->readOnly & WAL_SHM_RDONLY)==0 || useWal==0 );

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve,
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer,
  ** so that on the 100th (and last) RETRY we delay for 323 milliseconds.
  ** The total delay time before giving up is less than 10 seconds.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*(cnt-9)*39;
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    assert( rc==SQLITE_OK );
    if( pWal->bShmUnreliable==0 ){
      rc = walIndexReadHdr(pWal, pChanged);
    }
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS
        ** modules may return SQLITE_BUSY due to a race condition in the
        ** code that determines whether or not the shared-memory region
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    else if( pWal->bShmUnreliable ){
      return walBeginShmUnreliable(pWal, pChanged);
    }
  }

  assert( pWal->nWiData>0 );
  assert( pWal->apWiData[0]!=0 );
  pInfo = walCkptInfo(pWal);
  if( !useWal && AtomicLoad(&pInfo->nBackfill)==pWal->hdr.mxFrame
#ifdef SQLITE_ENABLE_SNAPSHOT
   && (pWal->pSnapshot==0 || pWal->hdr.mxFrame==0)
#endif
  ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshot. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  mxFrame = pWal->hdr.mxFrame;
#ifdef SQLITE_ENABLE_SNAPSHOT
  if( pWal->pSnapshot && pWal->pSnapshot->mxFrame<mxFrame ){
    mxFrame = pWal->pSnapshot->mxFrame;
  }
#endif
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = AtomicLoad(pInfo->aReadMark+i);
    if( mxReadMark<=thisMark && thisMark<=mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  if( (pWal->readOnly & WAL_SHM_RDONLY)==0
   && (mxReadMark<mxFrame || mxI==0)
  ){
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        AtomicStore(pInfo->aReadMark+i,mxFrame);
        mxReadMark = mxFrame;
        mxI = i;
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        break;
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  if( mxI==0 ){
    assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
    return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTINIT;
  }

  rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
  if( rc ){
    return rc==SQLITE_BUSY ? WAL_RETRY : rc;
  }
  /* Now that the read-lock has been obtained, check that neither the
  ** value in the aReadMark[] array or the contents of the wal-index
  ** header have changed.
  **
  ** It is necessary to check that the wal-index header did not change
  ** between the time it was read and when the shared-lock was obtained
  ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
  ** that the log file may have been wrapped by a writer, or that frames
  ** that occur later in the log than pWal->hdr.mxFrame may have been
  ** copied into the database by a checkpointer. If either of these things
  ** happened, then reading the database with the current value of
  ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
  ** instead.
  **
  ** Before checking that the live wal-index header has not changed
  ** since it was read, set Wal.minFrame to the first frame in the wal
  ** file that has not yet been checkpointed. This client will not need
  ** to read any frames earlier than minFrame from the wal file - they
  ** can be safely read directly from the database file.
  **
  ** Because a ShmBarrier() call is made between taking the copy of
  ** nBackfill and checking that the wal-header in shared-memory still
  ** matches the one cached in pWal->hdr, it is guaranteed that the
  ** checkpointer that set nBackfill was not working with a wal-index
  ** header newer than that cached in pWal->hdr. If it were, that could
  ** cause a problem. The checkpointer could omit to checkpoint
  ** a version of page X that lies before pWal->minFrame (call that version
  ** A) on the basis that there is a newer version (version B) of the same
  ** page later in the wal file. But if version B happens to like past
  ** frame pWal->hdr.mxFrame - then the client would incorrectly assume
  ** that it can read version A from the database file. However, since
  ** we can guarantee that the checkpointer that set nBackfill could not
  ** see any pages past pWal->hdr.mxFrame, this problem does not come up.
  */
  pWal->minFrame = AtomicLoad(&pInfo->nBackfill)+1;
  walShmBarrier(pWal);
  if( AtomicLoad(pInfo->aReadMark+mxI)!=mxReadMark
   || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
  ){
    walUnlockShared(pWal, WAL_READ_LOCK(mxI));
    return WAL_RETRY;
  }else{
    assert( mxReadMark<=pWal->hdr.mxFrame );
    pWal->readLock = (i16)mxI;
  }
  return rc;
}